

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_dump_level_map(command *cmd)

{
  _Bool _Var1;
  ang_file *fo;
  char title [80];
  char path [1024];
  
  memset(path,0,0x400);
  strnfmt(title,0x50,"Map of level %d");
  _Var1 = (*get_file)("level.html",path,0x400);
  if (_Var1) {
    _Var1 = get_string("Title for map: ",title,0x50);
    if (_Var1) {
      fo = file_open(path,MODE_WRITE,FTYPE_TEXT);
      if (fo != (ang_file *)0x0) {
        dump_level(fo,title,cave,(int **)0x0);
        _Var1 = file_close(fo);
        if (_Var1) {
          msg("Level dumped to %s.",path);
        }
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_dump_level_map(struct command *cmd)
{
	char path[1024] = "";
	char title[80];
	ang_file *fo;

	strnfmt(title, sizeof(title), "Map of level %d", player->depth);
	if (!get_file("level.html", path, sizeof(path)) ||
			!get_string("Title for map: ", title, sizeof(title))) {
		return;
	}
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		dump_level(fo, title, cave, NULL);
		if (file_close(fo)) {
			msg("Level dumped to %s.", path);
		}
	}
}